

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
               (Var arg,ScriptContext *scriptContext,PCWSTR methodName,JavascriptArray **array,
               RecyclableObject **obj,BigIndex *length)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptArray *pJVar6;
  uint64 initIndex;
  BigIndex local_58;
  BigIndex local_48;
  BigIndex *local_38;
  BigIndex *length_local;
  RecyclableObject **obj_local;
  JavascriptArray **array_local;
  PCWSTR methodName_local;
  ScriptContext *scriptContext_local;
  Var arg_local;
  
  local_38 = length;
  length_local = (BigIndex *)obj;
  obj_local = (RecyclableObject **)array;
  array_local = (JavascriptArray **)methodName;
  methodName_local = (PCWSTR)scriptContext;
  scriptContext_local = (ScriptContext *)arg;
  if (array == (JavascriptArray **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xc6c,"(array != nullptr)","array != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (length_local == (BigIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xc6d,"(obj != nullptr)","obj != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (local_38 == (BigIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xc6e,"(length != nullptr)","length != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pJVar6 = TryVarToNonES5Array(scriptContext_local);
  *obj_local = (RecyclableObject *)pJVar6;
  if ((*obj_local != (RecyclableObject *)0x0) &&
     (iVar3 = (*((*obj_local)->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x66])(), iVar3 == 0)) {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(*obj_local);
    *(RecyclableObject **)length_local = *obj_local;
    BigIndex::BigIndex(&local_48,
                       *(uint32 *)
                        &(*obj_local)[2].super_FinalizableObject.super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject);
    local_38->index = local_48.index;
    *(undefined4 *)&local_38->field_0x4 = local_48._4_4_;
    local_38->bigIndex = local_48.bigIndex;
    return;
  }
  BVar4 = JavascriptConversion::ToObject
                    (scriptContext_local,(ScriptContext *)methodName_local,
                     (RecyclableObject **)length_local);
  if (BVar4 != 0) {
    initIndex = OP_GetLength(*(Var *)length_local,(ScriptContext *)methodName_local);
    BigIndex::BigIndex(&local_58,initIndex);
    local_38->index = local_58.index;
    *(undefined4 *)&local_38->field_0x4 = local_58._4_4_;
    local_38->bigIndex = local_58.bigIndex;
    *obj_local = (RecyclableObject *)0x0;
    return;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)methodName_local,-0x7ff5ec42,(PCWSTR)array_local)
  ;
}

Assistant:

void JavascriptArray::TryGetArrayAndLength(Var arg,
        ScriptContext *scriptContext,
        PCWSTR methodName,
        __out JavascriptArray** array,
        __out RecyclableObject** obj,
        __out T * length)
    {
        Assert(array != nullptr);
        Assert(obj != nullptr);
        Assert(length != nullptr);

        *array = JavascriptArray::TryVarToNonES5Array(arg);
        if (*array && !(*array)->IsCrossSiteObject())
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(*array);
#endif
            *obj = *array;
            *length = (*array)->length;
        }
        else
        {
            if (!JavascriptConversion::ToObject(arg, scriptContext, obj))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, methodName);
            }
            *length = OP_GetLength(*obj, scriptContext);
            *array = nullptr;
        }
    }